

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_meta___call(lua_State *L)

{
  CTSize *pCVar1;
  ushort uVar2;
  CTSize CVar3;
  int iVar4;
  uint uVar5;
  GCcdata *pGVar6;
  cTValue *tv;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  TValue *pTVar10;
  GCstr *pGVar11;
  uint uVar12;
  MMS mm;
  uint uVar13;
  GCstr *name;
  long lVar14;
  byte bVar15;
  CTypeID id;
  CType *pCVar16;
  int in_ESI;
  CTState *cts;
  FPRArg *pFVar17;
  int iVar18;
  TValue *pTVar19;
  uint uVar20;
  GPRArg *dp;
  CType *pCVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  CTState *cts_00;
  ulong local_258;
  CType *local_240;
  uint local_230 [2];
  int rcl [2];
  FPRArg *local_208;
  CCallState cc;
  
  cts_00 = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts_00->L = L;
  pGVar6 = ffi_checkcdata(L,in_ESI);
  uVar2 = pGVar6->ctypeid;
  uVar13 = (uint)uVar2;
  if (uVar13 == 0x15) {
    mm = MM_new;
    id = pGVar6[1].nextgc.gcptr32;
    goto LAB_0014402b;
  }
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  pCVar16 = cts->tab;
  uVar20 = pCVar16[uVar13].info;
  local_240 = pCVar16 + uVar13;
  if ((uVar20 & 0xf0000000) == 0x20000000) {
    pCVar1 = &local_240->size;
    uVar9 = (ulong)((uVar20 & 0xffff) << 4);
    uVar20 = *(uint *)((long)&pCVar16->info + uVar9);
    if ((uVar20 & 0xf0000000) != 0x60000000) goto LAB_00144025;
    local_240 = (CType *)((long)&pCVar16->info + uVar9);
    if (*pCVar1 != 4) goto LAB_00143f55;
    cc.func._4_1_ = '\0';
    cc.func._5_1_ = '\0';
    cc.func._6_2_ = 0;
    cc.func._0_4_ = pGVar6[1].nextgc.gcptr32;
  }
  else {
    if ((uVar20 & 0xf0000000) != 0x60000000) {
LAB_00144025:
      mm = MM_call;
      id = (uint)uVar2;
LAB_0014402b:
      uVar13 = cts_00->tab[id].info;
      if ((uVar13 & 0xf0000000) == 0x20000000) {
        id = uVar13 & 0xffff;
      }
      tv = lj_ctype_meta(cts_00,id,mm);
      if (tv != (cTValue *)0x0) {
        lj_meta_tailcall(L,tv);
        return 0;
      }
      if (uVar2 == 0x15) {
        lj_cf_ffi_new(L);
        return 1;
      }
      pGVar11 = lj_ctype_repr(L,id,name);
      lj_err_callerv(L,LJ_ERR_FFI_BADCALL,pGVar11 + 1);
    }
LAB_00143f55:
    cc.func = *(_func_void **)(pGVar6 + 1);
  }
  pTVar10 = L->top;
  memset(cc.fpr,0,0xb0);
  uVar9 = (ulong)((uVar20 & 0xffff) << 4);
  uVar13 = *(uint *)((long)&pCVar16->info + uVar9);
  pCVar16 = (CType *)((long)&pCVar16->info + uVar9);
  if ((uVar13 & 0xf8000000) == 0x38000000) {
    local_258 = 0;
    if ((pCVar16->size != 8) && (pCVar16->size != 0x10)) {
LAB_00143fd8:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_258 = 0;
    if ((uVar13 & 0xf4000000) == 0x34000000 || (uVar13 & 0xf0000000) == 0x10000000) {
      pvVar7 = lj_mem_newgco(L,pCVar16->size + 8);
      *(undefined1 *)((long)pvVar7 + 5) = 10;
      *(short *)((long)pvVar7 + 6) = (short)uVar20;
      pTVar19 = L->top;
      L->top = pTVar19 + 1;
      (pTVar19->u32).lo = (uint32_t)pvVar7;
      (pTVar19->field_2).it = 0xfffffff5;
      if ((pCVar16->info & 0xf0000000) == 0x10000000) {
        rcl[0] = 0;
        rcl[1] = 0;
        iVar18 = ccall_classify_struct(cts,pCVar16,rcl,0);
        cc.retref = iVar18 != 0;
        if ((bool)cc.retref) {
          cc.gpr[0] = (long)pvVar7 + 8;
        }
        local_258 = (ulong)cc.retref;
      }
      else {
        cc.retref = '\0';
      }
    }
  }
  uVar20 = (uint)local_240->sib;
  pTVar19 = L->base;
  iVar18 = 1;
  uVar9 = 0;
  uVar13 = 0;
  while( true ) {
    pTVar19 = pTVar19 + 1;
    if (pTVar10 <= pTVar19) break;
    if (uVar20 == 0) {
      if ((local_240->info & 0x800000) == 0) goto LAB_001447c0;
      uVar5 = lj_ccall_ctid_vararg(cts,pTVar19);
      pCVar16 = cts->tab;
      uVar20 = 0;
    }
    else {
      pCVar16 = cts->tab;
      uVar5 = (uint)(ushort)pCVar16[uVar20].info;
      uVar20 = (uint)pCVar16[uVar20].sib;
    }
    uVar12 = pCVar16[uVar5].info;
    pCVar16 = pCVar16 + uVar5;
    uVar5 = pCVar16->size;
    uVar22 = (uint)uVar9;
    if (uVar12 < 0x10000000) {
      if (8 < uVar5) goto LAB_00143fd8;
      uVar23 = uVar5 + 7 >> 3;
      uVar24 = uVar23;
      if ((uVar12 >> 0x1a & 1) == 0) goto LAB_00144322;
      bVar15 = 0;
LAB_00144302:
      if (uVar23 + uVar22 < 9) {
        dp = (GPRArg *)(cc.fpr[0].b + uVar9 * 0x10);
        uVar22 = uVar23 + uVar22;
      }
      else {
LAB_0014434c:
        if (0x30000 < (pCVar16->info & 0xf0000)) {
          uVar5 = -1 << ((byte)(pCVar16->info + 0xd0000 >> 0x10) & 0xf);
          uVar13 = uVar13 + ~uVar5 & uVar5;
        }
        if (0x20 < uVar13 + uVar24) goto LAB_00143fd8;
        dp = cc.stack + uVar13;
        uVar13 = uVar13 + uVar24;
      }
LAB_001443a7:
      lj_cconv_ct_tv(cts,pCVar16,(uint8_t *)dp,pTVar19,iVar18 << 8);
      if (((pCVar16->info & 0xf4000000) == 0) && (uVar5 = pCVar16->size, uVar5 < 4)) {
        if ((pCVar16->info >> 0x17 & 1) == 0) {
          if (uVar5 == 1) {
            uVar5 = (uint)(char)(byte)*dp;
          }
          else {
            uVar5 = (uint)(short)(ushort)*dp;
          }
        }
        else if (uVar5 == 1) {
          uVar5 = (uint)(byte)*dp;
        }
        else {
          uVar5 = (uint)(ushort)*dp;
        }
        *(uint *)dp = uVar5;
      }
      if (((bool)(bVar15 & uVar24 == 2)) &&
         (dp == (GPRArg *)(cc.fpr[0].b + (ulong)(uVar22 - 2) * 0x10))) {
        cc.fpr[uVar22 - 1].d[0] = (double)dp[1];
        dp[1] = 0;
      }
    }
    else {
      if ((uVar12 & 0xf8000000) == 0x38000000) {
        if ((uVar5 == 8) || (uVar5 == 0x10)) {
          bVar15 = 0;
          uVar23 = 1;
          uVar24 = uVar5 + 7 >> 3;
          goto LAB_00144302;
        }
        goto LAB_00143fd8;
      }
      if ((uVar12 & 0xf0000000) != 0x10000000) {
        uVar24 = 1;
        if ((uVar12 & 0xf4000000) == 0x34000000) {
          uVar23 = uVar5 + 7 >> 3;
          bVar15 = 1;
          uVar24 = uVar23;
          goto LAB_00144302;
        }
LAB_00144322:
        uVar5 = uVar24 + (int)local_258;
        if (6 < uVar5) {
          bVar15 = 0;
          goto LAB_0014434c;
        }
        dp = cc.gpr + local_258;
        bVar15 = 0;
        local_258 = (ulong)uVar5;
        goto LAB_001443a7;
      }
      local_230[0] = 0;
      local_230[1] = 0;
      iVar4 = ccall_classify_struct(cts,pCVar16,(int *)local_230,0);
      if (iVar4 != 0) {
        uVar24 = uVar5 + 7 >> 3;
        if (uVar5 + 7 < 0x18) goto LAB_00144322;
        bVar15 = 0;
        goto LAB_0014434c;
      }
      cc.ngpr = (uint8_t)local_258;
      rcl[0] = 0;
      rcl[1] = 0;
      cc.nsp = (uint8_t)uVar13;
      cc.nfpr = (uint8_t)uVar9;
      lj_cconv_ct_tv(cts,pCVar16,(uint8_t *)rcl,pTVar19,iVar18 << 8);
      uVar9 = (ulong)cc.nfpr;
      local_258 = (ulong)cc.ngpr;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        if ((rcl[lVar14 + -2] & 1U) == 0) {
          uVar8 = local_258;
          if ((rcl[lVar14 + -2] & 2U) != 0) {
            if (7 < (uint)uVar9) goto LAB_00144543;
            cc.fpr[uVar9].d[0] = *(double *)(rcl + lVar14 * 2);
            uVar9 = (ulong)((uint)uVar9 + 1);
          }
        }
        else {
          if (5 < (uint)local_258) {
LAB_00144543:
            uVar9 = (ulong)cc.nsp;
            iVar4 = 2 - (uint)(local_230[1] == 0);
            uVar13 = iVar4 + (uint)cc.nsp;
            if (0x20 < uVar13) goto LAB_00143fd8;
            cc.nsp = (uint8_t)uVar13;
            memcpy(cc.stack + uVar9,rcl,(ulong)(uint)(iVar4 * 8));
            local_258 = (ulong)cc.ngpr;
            uVar9 = (ulong)cc.nfpr;
            goto LAB_00144586;
          }
          uVar8 = (ulong)((uint)local_258 + 1);
          cc.gpr[local_258] = *(GPRArg *)(rcl + lVar14 * 2);
        }
        local_258 = uVar8;
      }
      cc.ngpr = (uint8_t)local_258;
      cc.nfpr = (uint8_t)uVar9;
LAB_00144586:
      uVar13 = (uint)cc.nsp;
      local_258 = local_258 & 0xff;
      uVar22 = (uint)(byte)uVar9;
    }
    iVar18 = iVar18 + 1;
    uVar9 = (ulong)uVar22;
  }
  if (uVar20 != 0) {
LAB_001447c0:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  cc.spadj = 8;
  if (1 < uVar13) {
    cc.spadj = uVar13 * 8 | 8;
  }
  pCVar16 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  cc.nsp = (uint8_t)uVar13;
  cc.nfpr = (uint8_t)uVar9;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    rcl = (int  [2])((ulong)cc.func | 0xffff000000000000);
    pTVar10 = lj_tab_set(L,cts->miscmap,(cTValue *)rcl);
    (pTVar10->field_2).it = 0xfffffffd;
  }
  pCVar21 = cts->tab;
  uVar2 = *(ushort *)(((long)local_240 - (long)pCVar16) + (long)pCVar21);
  uVar13 = pCVar21[uVar2].info;
  if ((uVar13 & 0xf0000000) == 0x40000000) {
    iVar18 = 0;
    iVar4 = 0;
    goto LAB_0014479d;
  }
  pCVar21 = pCVar21 + uVar2;
  if ((uVar13 & 0xf0000000) == 0x10000000) {
    if (cc.retref == '\0') {
      uVar13 = L->top[-1].u32.lo;
      local_230[0] = 0;
      local_230[1] = 0;
      ccall_classify_struct(cts,pCVar21,(int *)local_230,0);
      uVar20 = pCVar21->size;
      uVar5 = 0;
      uVar12 = 0;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        if ((rcl[lVar14 + -2] & 1U) == 0) {
          if ((rcl[lVar14 + -2] & 2U) != 0) {
            uVar9 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
            pFVar17 = cc.fpr + uVar9;
            goto LAB_001446f3;
          }
        }
        else {
          uVar9 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          pFVar17 = (FPRArg *)(cc.gpr + uVar9);
LAB_001446f3:
          *(double *)(rcl + lVar14 * 2) = pFVar17->d[0];
        }
      }
      memcpy((void *)((ulong)uVar13 + 8),rcl,(ulong)uVar20);
    }
LAB_0014475f:
    iVar18 = 1;
    iVar4 = 1;
  }
  else {
    if ((uVar13 & 0xf4000000) == 0x4000000) {
LAB_00144774:
      local_208 = cc.fpr;
    }
    else {
      if ((uVar13 & 0xf4000000) == 0x34000000) {
        CVar3 = pCVar21->size;
        uVar9 = (ulong)L->top[-1].u32.lo;
        *(double *)(uVar9 + 8) = cc.fpr[0].d[0];
        if (CVar3 != 8) {
          *(double *)(uVar9 + 0x10) = cc.fpr[1].d[0];
        }
        goto LAB_0014475f;
      }
      local_208 = (FPRArg *)cc.gpr;
      if ((uVar13 & 0xf8000000) == 0x38000000) goto LAB_00144774;
    }
    iVar4 = lj_cconv_tv_ct(cts,pCVar21,0,L->top + -1,local_208->b);
    iVar18 = 1;
  }
LAB_0014479d:
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    uVar9 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar9 + 0x24) <= *(uint *)(uVar9 + 0x20)) {
      lj_gc_step(L);
    }
  }
  return iVar18;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}